

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_converter.cpp
# Opt level: O1

void duckdb::SetArrowFormat
               (DuckDBArrowSchemaHolder *root_holder,ArrowSchema *child,LogicalType *type,
               ClientProperties *options,ClientContext *context)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ArrowSchema *pAVar3;
  ArrowSchema **ppAVar4;
  value_type pAVar5;
  iterator iVar6;
  char cVar7;
  bool bVar8;
  PhysicalType PVar9;
  long *plVar10;
  char *pcVar11;
  reference pvVar12;
  idx_t __val;
  long lVar13;
  const_reference pvVar14;
  NotImplementedException *this;
  undefined8 *puVar15;
  LogicalType *type_00;
  _List_node_base *p_Var16;
  reference pvVar17;
  reference ppAVar18;
  InternalException *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var19;
  idx_t iVar20;
  ulong uVar21;
  ulong *puVar22;
  size_type *psVar23;
  char *pcVar24;
  LogicalType *type_01;
  ulong __n;
  char cVar25;
  undefined8 uVar26;
  vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true> *this_01;
  uint uVar27;
  size_type __n_00;
  uint8_t scale;
  string format;
  uint8_t width;
  string __str;
  string __str_2;
  string __str_1;
  byte local_119;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  ArrowSchema *local_d8;
  byte local_c9;
  undefined1 local_c8 [32];
  DuckDBArrowSchemaHolder *local_a8;
  ClientContext *local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_98;
  long local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  long lStack_80;
  vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
  *local_78;
  char **local_70;
  long local_68;
  char *local_60 [2];
  string local_50;
  
  bVar8 = LogicalType::HasAlias(type);
  if ((bVar8) &&
     (((bVar8 = LogicalType::IsJSONType(type), !bVar8 ||
       (options->arrow_lossless_conversion == true)) &&
      (bVar8 = SetArrowExtension(root_holder,child,type,context), bVar8)))) {
    return;
  }
  switch(type->id_) {
  case SQLNULL:
    pcVar11 = "n";
    break;
  case UNKNOWN:
  case ANY:
  case USER:
  case USER|SQLNULL:
  case USER|UNKNOWN:
  case USER|ANY:
  case 8:
  case 9:
  case CHAR:
  case TIMESTAMP_TZ|SQLNULL:
  case TIME_TZ|SQLNULL:
  case STRING_LITERAL:
  case INTEGER_LITERAL:
  case VARINT:
  case 0x28:
  case 0x29:
  case TIMESTAMP_TZ|BOOLEAN:
  case TIMESTAMP_TZ|TINYINT:
  case TIMESTAMP_TZ|SMALLINT:
  case TIMESTAMP_TZ|INTEGER:
  case TIMESTAMP_TZ|BIGINT:
  case TIMESTAMP_TZ|DATE:
  case TIMESTAMP_TZ|TIME:
  case UHUGEINT:
  case POINTER:
  case TIMESTAMP_TZ|TIMESTAMP_NS:
  case VALIDITY:
switchD_0159ab03_caseD_2:
    bVar8 = SetArrowExtension(root_holder,child,type,context);
    if (bVar8) {
      return;
    }
    this = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"Unsupported Arrow type %s","");
    LogicalType::ToString_abi_cxx11_(&local_50,type);
    NotImplementedException::NotImplementedException<std::__cxx11::string>(this,&local_f8,&local_50)
    ;
    __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case BOOLEAN:
    if (options->arrow_lossless_conversion == true) {
LAB_0159ad55:
      SetArrowExtension(root_holder,child,type,context);
      return;
    }
    pcVar11 = "b";
    break;
  case TINYINT:
    pcVar11 = "c";
    break;
  case SMALLINT:
    pcVar11 = "s";
    break;
  case INTEGER:
    pcVar11 = "i";
    break;
  case BIGINT:
    pcVar11 = "l";
    break;
  case DATE:
    pcVar11 = "tdD";
    break;
  case TIME:
    goto switchD_0159ab03_caseD_10;
  case TIMESTAMP_SEC:
    pcVar11 = "tss:";
    break;
  case TIMESTAMP_MS:
    pcVar11 = "tsm:";
    break;
  case TIMESTAMP:
    pcVar11 = "tsu:";
    break;
  case TIMESTAMP_NS:
    pcVar11 = "tsn:";
    break;
  case DECIMAL:
    local_d8 = child;
    LogicalType::GetDecimalProperties(type,&local_c9,&local_119);
    uVar27 = 1;
    if (9 < local_c9) {
      uVar27 = 3 - (local_c9 < 100);
    }
    local_c8._0_8_ = local_c8 + 0x10;
    ::std::__cxx11::string::_M_construct((ulong)local_c8,(char)uVar27);
    ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_c8._0_8_,uVar27,(uint)local_c9);
    plVar10 = (long *)::std::__cxx11::string::replace((ulong)local_c8,0,(char *)0x0,0x1edb001);
    p_Var19 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(plVar10 + 2);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)*plVar10 == p_Var19) {
      local_88._M_pi = p_Var19->_M_pi;
      lStack_80 = plVar10[3];
      local_98 = &local_88;
    }
    else {
      local_88._M_pi = p_Var19->_M_pi;
      local_98 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)*plVar10;
    }
    local_90 = plVar10[1];
    *plVar10 = (long)p_Var19;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    puVar15 = (undefined8 *)::std::__cxx11::string::append((char *)&local_98);
    paVar2 = &local_118.field_2;
    puVar22 = puVar15 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar22) {
      local_118.field_2._M_allocated_capacity = *puVar22;
      local_118.field_2._8_8_ = puVar15[3];
      local_118._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_118.field_2._M_allocated_capacity = *puVar22;
      local_118._M_dataplus._M_p = (pointer)*puVar15;
    }
    local_118._M_string_length = puVar15[1];
    *puVar15 = puVar22;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    uVar27 = 1;
    if (9 < local_119) {
      uVar27 = 3 - (local_119 < 100);
    }
    local_70 = local_60;
    ::std::__cxx11::string::_M_construct((ulong)&local_70,(char)uVar27);
    ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_70,uVar27,(uint)local_119);
    uVar26 = (char *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar2) {
      uVar26 = local_118.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar26 < (char *)(local_118._M_string_length + local_68)) {
      pcVar11 = (char *)0xf;
      if (local_70 != local_60) {
        pcVar11 = local_60[0];
      }
      if (pcVar11 < (char *)(local_118._M_string_length + local_68)) goto LAB_0159b586;
      puVar15 = (undefined8 *)
                ::std::__cxx11::string::replace
                          ((ulong)&local_70,0,(char *)0x0,(ulong)local_118._M_dataplus._M_p);
    }
    else {
LAB_0159b586:
      puVar15 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_70);
    }
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    psVar23 = puVar15 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar23) {
      local_f8.field_2._M_allocated_capacity = *psVar23;
      local_f8.field_2._8_8_ = puVar15[3];
    }
    else {
      local_f8.field_2._M_allocated_capacity = *psVar23;
      local_f8._M_dataplus._M_p = (pointer)*puVar15;
    }
    local_f8._M_string_length = puVar15[1];
    *puVar15 = psVar23;
    puVar15[1] = 0;
    *(undefined1 *)psVar23 = 0;
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    pAVar3 = local_d8;
    if (local_98 != &local_88) {
      operator_delete(local_98);
    }
    if ((pointer)local_c8._0_8_ != (pointer)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_);
    }
    AddName((duckdb *)&local_118,&local_f8);
    ::std::
    vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
    ::emplace_back<duckdb::unique_ptr<char[],std::default_delete<char>,false>>
              ((vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
                *)&root_holder->owned_type_names,
               (unique_ptr<char[],_std::default_delete<char>,_false> *)&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete__(local_118._M_dataplus._M_p);
    }
    pvVar12 = vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true>::back
                        (&root_holder->owned_type_names);
    pAVar3->format =
         (pvVar12->super_unique_ptr<char[],_std::default_delete<char[]>_>)._M_t.
         super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
         super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
    goto LAB_0159b85c;
  case FLOAT:
    pcVar11 = "f";
    break;
  case DOUBLE:
    pcVar11 = "g";
    break;
  case VARCHAR:
    goto LAB_0159ad1d;
  case BLOB:
    goto LAB_0159ad77;
  case INTERVAL:
    pcVar11 = "tin";
    break;
  case UTINYINT:
    pcVar11 = "C";
    break;
  case USMALLINT:
    pcVar11 = "S";
    break;
  case UINTEGER:
    pcVar11 = "I";
    break;
  case UBIGINT:
    pcVar11 = "L";
    break;
  case TIMESTAMP_TZ:
    ::std::operator+(&local_f8,"tsu:",&options->time_zone);
    AddName((duckdb *)&local_118,&local_f8);
    ::std::
    vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
    ::emplace_back<duckdb::unique_ptr<char[],std::default_delete<char>,false>>
              ((vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
                *)&root_holder->owned_type_names,
               (unique_ptr<char[],_std::default_delete<char>,_false> *)&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete__(local_118._M_dataplus._M_p);
    }
    pvVar12 = vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true>::back
                        (&root_holder->owned_type_names);
    child->format =
         (pvVar12->super_unique_ptr<char[],_std::default_delete<char[]>_>)._M_t.
         super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
         super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
    goto LAB_0159b85c;
  case TIME_TZ:
    if (options->arrow_lossless_conversion == true) goto LAB_0159ad55;
    goto switchD_0159ab03_caseD_10;
  case BIT:
    if (options->arrow_lossless_conversion == true) goto LAB_0159ad55;
LAB_0159ad77:
    if (options->arrow_offset_size == LARGE) {
      pcVar11 = "Z";
    }
    else {
      pcVar11 = "z";
    }
    break;
  case HUGEINT:
    if (options->arrow_lossless_conversion == true) goto LAB_0159ad55;
    pcVar11 = "d:38,0";
    break;
  case UUID:
    if (options->arrow_lossless_conversion == true) goto LAB_0159ad55;
LAB_0159ad1d:
    if (options->produce_arrow_string_view == true) {
      pcVar11 = "vu";
    }
    else if (options->arrow_offset_size == LARGE) {
      pcVar11 = "U";
    }
    else {
      pcVar11 = "u";
    }
    break;
  default:
    local_a0 = context;
    switch(type->id_) {
    case STRUCT:
      SetArrowStructFormat(root_holder,child,type,options,context,false);
      return;
    case LIST:
      bVar8 = options->arrow_offset_size == LARGE;
      pcVar11 = "+vl";
      if (bVar8) {
        pcVar11 = "+vL";
      }
      pcVar24 = "+l";
      if (bVar8) {
        pcVar24 = "+L";
      }
      if (options->arrow_use_list_view != false) {
        pcVar24 = pcVar11;
      }
      child->format = pcVar24;
      child->n_children = 1;
      p_Var16 = (_List_node_base *)operator_new(0x28);
      p_Var16[1]._M_next = (_List_node_base *)0x0;
      p_Var16[1]._M_prev = (_List_node_base *)0x0;
      p_Var16[2]._M_next = (_List_node_base *)0x0;
      ::std::__detail::_List_node_base::_M_hook(p_Var16);
      psVar1 = &(root_holder->nested_children).
                super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      ::std::vector<ArrowSchema,_std::allocator<ArrowSchema>_>::resize
                ((vector<ArrowSchema,_std::allocator<ArrowSchema>_> *)
                 ((root_holder->nested_children).
                  super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                  ._M_impl._M_node.super__List_node_base._M_prev + 1),1);
      p_Var16 = (_List_node_base *)operator_new(0x28);
      p_Var16[1]._M_next = (_List_node_base *)0x0;
      p_Var16[1]._M_prev = (_List_node_base *)0x0;
      p_Var16[2]._M_next = (_List_node_base *)0x0;
      ::std::__detail::_List_node_base::_M_hook(p_Var16);
      psVar1 = &(root_holder->nested_children_ptr).
                super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      p_Var16 = (root_holder->nested_children_ptr).
                super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
                ._M_impl._M_node.super__List_node_base._M_prev;
      local_f8._M_dataplus._M_p =
           (pointer)vector<ArrowSchema,_true>::operator[]
                              ((vector<ArrowSchema,_true> *)
                               ((root_holder->nested_children).
                                super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                                ._M_impl._M_node.super__List_node_base._M_prev + 1),0);
      iVar6._M_current = (ArrowSchema **)p_Var16[1]._M_prev;
      if ((_List_node_base *)iVar6._M_current == p_Var16[2]._M_next) {
        ::std::vector<ArrowSchema*,std::allocator<ArrowSchema*>>::_M_realloc_insert<ArrowSchema*>
                  ((vector<ArrowSchema*,std::allocator<ArrowSchema*>> *)(p_Var16 + 1),iVar6,
                   (ArrowSchema **)&local_f8);
      }
      else {
        *iVar6._M_current = (ArrowSchema *)local_f8._M_dataplus._M_p;
        p_Var16[1]._M_prev = (_List_node_base *)&(p_Var16[1]._M_prev)->_M_prev;
      }
      pvVar17 = vector<ArrowSchema,_true>::operator[]
                          ((vector<ArrowSchema,_true> *)
                           ((root_holder->nested_children).
                            super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                            ._M_impl._M_node.super__List_node_base._M_prev + 1),0);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,anon_var_dwarf_63b5960 + 9);
      InitializeChild(pvVar17,root_holder,&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      ppAVar18 = vector<ArrowSchema_*,_true>::operator[]
                           ((vector<ArrowSchema_*,_true> *)
                            ((root_holder->nested_children_ptr).
                             super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
                             ._M_impl._M_node.super__List_node_base._M_prev + 1),0);
      child->children = ppAVar18;
      (*ppAVar18)->name = "l";
      pAVar3 = *ppAVar18;
      type_00 = ListType::GetChildType(type);
      SetArrowFormat(root_holder,pAVar3,type_00,options,local_a0);
      return;
    case MAP:
      SetArrowMapFormat(root_holder,child,type,options,context);
      return;
    default:
      goto switchD_0159ab03_caseD_2;
    case ENUM:
      PVar9 = EnumType::GetPhysicalType(type);
      if (PVar9 == UINT8) {
        pcVar11 = "C";
      }
      else if (PVar9 == UINT32) {
        pcVar11 = "I";
      }
      else {
        if (PVar9 != UINT16) {
          this_00 = (InternalException *)__cxa_allocate_exception(0x10);
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f8,"Unsupported Enum Internal Type","");
          InternalException::InternalException(this_00,&local_f8);
          __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pcVar11 = "S";
      }
      child->format = pcVar11;
      p_Var16 = (_List_node_base *)operator_new(0x28);
      p_Var16[1]._M_next = (_List_node_base *)0x0;
      p_Var16[1]._M_prev = (_List_node_base *)0x0;
      p_Var16[2]._M_next = (_List_node_base *)0x0;
      ::std::__detail::_List_node_base::_M_hook(p_Var16);
      psVar1 = &(root_holder->nested_children).
                super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      ::std::vector<ArrowSchema,_std::allocator<ArrowSchema>_>::resize
                ((vector<ArrowSchema,_std::allocator<ArrowSchema>_> *)
                 ((root_holder->nested_children).
                  super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                  ._M_impl._M_node.super__List_node_base._M_prev + 1),1);
      p_Var16 = (_List_node_base *)operator_new(0x28);
      p_Var16[1]._M_next = (_List_node_base *)0x0;
      p_Var16[1]._M_prev = (_List_node_base *)0x0;
      p_Var16[2]._M_next = (_List_node_base *)0x0;
      ::std::__detail::_List_node_base::_M_hook(p_Var16);
      psVar1 = &(root_holder->nested_children_ptr).
                super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      p_Var16 = (root_holder->nested_children_ptr).
                super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
                ._M_impl._M_node.super__List_node_base._M_prev;
      local_f8._M_dataplus._M_p =
           (pointer)vector<ArrowSchema,_true>::operator[]
                              ((vector<ArrowSchema,_true> *)
                               ((root_holder->nested_children).
                                super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                                ._M_impl._M_node.super__List_node_base._M_prev + 1),0);
      iVar6._M_current = (ArrowSchema **)p_Var16[1]._M_prev;
      if ((_List_node_base *)iVar6._M_current == p_Var16[2]._M_next) {
        ::std::vector<ArrowSchema*,std::allocator<ArrowSchema*>>::_M_realloc_insert<ArrowSchema*>
                  ((vector<ArrowSchema*,std::allocator<ArrowSchema*>> *)(p_Var16 + 1),iVar6,
                   (ArrowSchema **)&local_f8);
      }
      else {
        *iVar6._M_current = (ArrowSchema *)local_f8._M_dataplus._M_p;
        p_Var16[1]._M_prev = (_List_node_base *)&(p_Var16[1]._M_prev)->_M_prev;
      }
      pvVar17 = vector<ArrowSchema,_true>::operator[]
                          ((vector<ArrowSchema,_true> *)
                           ((root_holder->nested_children).
                            super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                            ._M_impl._M_node.super__List_node_base._M_prev + 1),0);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,anon_var_dwarf_63b5960 + 9);
      InitializeChild(pvVar17,root_holder,&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      ppAVar18 = vector<ArrowSchema_*,_true>::operator[]
                           ((vector<ArrowSchema_*,_true> *)
                            ((root_holder->nested_children_ptr).
                             super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
                             ._M_impl._M_node.super__List_node_base._M_prev + 1),0);
      pAVar5 = *ppAVar18;
      child->dictionary = pAVar5;
      pAVar5->format = "u";
      return;
    case UNION:
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"+us:","");
      UnionType::CopyMemberTypes_abi_cxx11_
                ((child_list_t<LogicalType> *)local_c8,(UnionType *)type,type_01);
      lVar13 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                         (((long)(local_c8._8_8_ - local_c8._0_8_) >> 3) * 0x6db6db6db6db6db7);
      child->n_children = lVar13;
      p_Var16 = (_List_node_base *)operator_new(0x28);
      p_Var16[1]._M_next = (_List_node_base *)0x0;
      p_Var16[1]._M_prev = (_List_node_base *)0x0;
      p_Var16[2]._M_next = (_List_node_base *)0x0;
      ::std::__detail::_List_node_base::_M_hook(p_Var16);
      psVar1 = &(root_holder->nested_children).
                super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      ::std::vector<ArrowSchema,_std::allocator<ArrowSchema>_>::resize
                ((vector<ArrowSchema,_std::allocator<ArrowSchema>_> *)
                 ((root_holder->nested_children).
                  super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                  ._M_impl._M_node.super__List_node_base._M_prev + 1),
                 ((long)(local_c8._8_8_ - local_c8._0_8_) >> 3) * 0x6db6db6db6db6db7);
      p_Var16 = (_List_node_base *)operator_new(0x28);
      p_Var16[1]._M_next = (_List_node_base *)0x0;
      p_Var16[1]._M_prev = (_List_node_base *)0x0;
      p_Var16[2]._M_next = (_List_node_base *)0x0;
      ::std::__detail::_List_node_base::_M_hook(p_Var16);
      psVar1 = &(root_holder->nested_children_ptr).
                super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      ::std::vector<ArrowSchema_*,_std::allocator<ArrowSchema_*>_>::resize
                ((vector<ArrowSchema_*,_std::allocator<ArrowSchema_*>_> *)
                 ((root_holder->nested_children_ptr).
                  super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
                  ._M_impl._M_node.super__List_node_base._M_prev + 1),
                 ((long)(local_c8._8_8_ - local_c8._0_8_) >> 3) * 0x6db6db6db6db6db7);
      if (local_c8._8_8_ != local_c8._0_8_) {
        __n_00 = 0;
        do {
          pvVar17 = vector<ArrowSchema,_true>::operator[]
                              ((vector<ArrowSchema,_true> *)
                               ((root_holder->nested_children).
                                super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                                ._M_impl._M_node.super__List_node_base._M_prev + 1),__n_00);
          ppAVar18 = vector<ArrowSchema_*,_true>::operator[]
                               ((vector<ArrowSchema_*,_true> *)
                                ((root_holder->nested_children_ptr).
                                 super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
                                 ._M_impl._M_node.super__List_node_base._M_prev + 1),__n_00);
          *ppAVar18 = pvVar17;
          __n_00 = __n_00 + 1;
        } while (__n_00 < (ulong)(((long)(local_c8._8_8_ - local_c8._0_8_) >> 3) *
                                 0x6db6db6db6db6db7));
      }
      ppAVar18 = vector<ArrowSchema_*,_true>::operator[]
                           ((vector<ArrowSchema_*,_true> *)
                            ((root_holder->nested_children_ptr).
                             super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
                             ._M_impl._M_node.super__List_node_base._M_prev + 1),0);
      child->children = ppAVar18;
      local_d8 = child;
      local_a8 = root_holder;
      if (local_c8._8_8_ != local_c8._0_8_) {
        paVar2 = &local_118.field_2;
        local_78 = (vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
                    *)&root_holder->owned_type_names;
        __n = 0;
        do {
          pAVar3 = local_d8->children[__n];
          local_118._M_dataplus._M_p = (pointer)paVar2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_118,anon_var_dwarf_63b5960 + 9);
          InitializeChild(pAVar3,local_a8,&local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != paVar2) {
            operator_delete(local_118._M_dataplus._M_p);
          }
          pvVar14 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                    ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                                  *)local_c8,__n);
          AddName((duckdb *)&local_118,&pvVar14->first);
          ::std::
          vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
          ::emplace_back<duckdb::unique_ptr<char[],std::default_delete<char>,false>>
                    (local_78,(unique_ptr<char[],_std::default_delete<char>,_false> *)&local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete__(local_118._M_dataplus._M_p);
          }
          pvVar12 = vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true>::back
                              ((vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true>
                                *)local_78);
          ppAVar4 = local_d8->children;
          ppAVar4[__n]->name =
               (pvVar12->super_unique_ptr<char[],_std::default_delete<char[]>_>)._M_t.
               super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl;
          pAVar3 = ppAVar4[__n];
          pvVar14 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                    ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                                  *)local_c8,__n);
          SetArrowFormat(local_a8,pAVar3,&pvVar14->second,options,local_a0);
          cVar25 = '\x01';
          if (9 < __n) {
            uVar21 = __n;
            cVar7 = '\x04';
            do {
              cVar25 = cVar7;
              if (uVar21 < 100) {
                cVar25 = cVar25 + -2;
                goto LAB_0159b252;
              }
              if (uVar21 < 1000) {
                cVar25 = cVar25 + -1;
                goto LAB_0159b252;
              }
              if (uVar21 < 10000) goto LAB_0159b252;
              bVar8 = 99999 < uVar21;
              uVar21 = uVar21 / 10000;
              cVar7 = cVar25 + '\x04';
            } while (bVar8);
            cVar25 = cVar25 + '\x01';
          }
LAB_0159b252:
          local_98 = &local_88;
          ::std::__cxx11::string::_M_construct((ulong)&local_98,cVar25);
          ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_98,(uint)local_90,__n);
          plVar10 = (long *)::std::__cxx11::string::append((char *)&local_98);
          puVar22 = (ulong *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar22) {
            local_118.field_2._M_allocated_capacity = *puVar22;
            local_118.field_2._8_8_ = plVar10[3];
            local_118._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_118.field_2._M_allocated_capacity = *puVar22;
            local_118._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_118._M_string_length = plVar10[1];
          *plVar10 = (long)puVar22;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_118._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != paVar2) {
            operator_delete(local_118._M_dataplus._M_p);
          }
          if (local_98 != &local_88) {
            operator_delete(local_98);
          }
          __n = __n + 1;
        } while (__n < (ulong)(((long)(local_c8._8_8_ - local_c8._0_8_) >> 3) * 0x6db6db6db6db6db7))
        ;
      }
      ::std::__cxx11::string::pop_back();
      AddName((duckdb *)&local_118,&local_f8);
      this_01 = &local_a8->owned_type_names;
      ::std::
      vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
      ::emplace_back<duckdb::unique_ptr<char[],std::default_delete<char>,false>>
                ((vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
                  *)this_01,(unique_ptr<char[],_std::default_delete<char>,_false> *)&local_118);
      pAVar3 = local_d8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete__(local_118._M_dataplus._M_p);
      }
      pvVar12 = vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true>::back
                          (this_01);
      pAVar3->format =
           (pvVar12->super_unique_ptr<char[],_std::default_delete<char[]>_>)._M_t.
           super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl;
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 *)local_c8);
      break;
    case ARRAY:
      __val = ArrayType::GetSize(type);
      local_d8 = (ArrowSchema *)ArrayType::GetChildType(type);
      cVar25 = '\x01';
      if (9 < __val) {
        iVar20 = __val;
        cVar7 = '\x04';
        do {
          cVar25 = cVar7;
          if (iVar20 < 100) {
            cVar25 = cVar25 + -2;
            goto LAB_0159b871;
          }
          if (iVar20 < 1000) {
            cVar25 = cVar25 + -1;
            goto LAB_0159b871;
          }
          if (iVar20 < 10000) goto LAB_0159b871;
          bVar8 = 99999 < iVar20;
          iVar20 = iVar20 / 10000;
          cVar7 = cVar25 + '\x04';
        } while (bVar8);
        cVar25 = cVar25 + '\x01';
      }
LAB_0159b871:
      paVar2 = &local_118.field_2;
      local_118._M_dataplus._M_p = (pointer)paVar2;
      ::std::__cxx11::string::_M_construct((ulong)&local_118,cVar25);
      ::std::__detail::__to_chars_10_impl<unsigned_long>
                (local_118._M_dataplus._M_p,(uint)local_118._M_string_length,__val);
      puVar15 = (undefined8 *)
                ::std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,0x1e3e394);
      psVar23 = puVar15 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar23) {
        local_f8.field_2._M_allocated_capacity = *psVar23;
        local_f8.field_2._8_8_ = puVar15[3];
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      }
      else {
        local_f8.field_2._M_allocated_capacity = *psVar23;
        local_f8._M_dataplus._M_p = (pointer)*puVar15;
      }
      local_f8._M_string_length = puVar15[1];
      *puVar15 = psVar23;
      puVar15[1] = 0;
      *(undefined1 *)(puVar15 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      AddName((duckdb *)&local_118,&local_f8);
      ::std::
      vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
      ::emplace_back<duckdb::unique_ptr<char[],std::default_delete<char>,false>>
                ((vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
                  *)&root_holder->owned_type_names,
                 (unique_ptr<char[],_std::default_delete<char>,_false> *)&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete__(local_118._M_dataplus._M_p);
      }
      pvVar12 = vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true>::back
                          (&root_holder->owned_type_names);
      child->format =
           (pvVar12->super_unique_ptr<char[],_std::default_delete<char[]>_>)._M_t.
           super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl;
      child->n_children = 1;
      p_Var16 = (_List_node_base *)operator_new(0x28);
      p_Var16[1]._M_next = (_List_node_base *)0x0;
      p_Var16[1]._M_prev = (_List_node_base *)0x0;
      p_Var16[2]._M_next = (_List_node_base *)0x0;
      ::std::__detail::_List_node_base::_M_hook(p_Var16);
      psVar1 = &(root_holder->nested_children).
                super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      ::std::vector<ArrowSchema,_std::allocator<ArrowSchema>_>::resize
                ((vector<ArrowSchema,_std::allocator<ArrowSchema>_> *)
                 ((root_holder->nested_children).
                  super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                  ._M_impl._M_node.super__List_node_base._M_prev + 1),1);
      p_Var16 = (_List_node_base *)operator_new(0x28);
      p_Var16[1]._M_next = (_List_node_base *)0x0;
      p_Var16[1]._M_prev = (_List_node_base *)0x0;
      p_Var16[2]._M_next = (_List_node_base *)0x0;
      ::std::__detail::_List_node_base::_M_hook(p_Var16);
      psVar1 = &(root_holder->nested_children_ptr).
                super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      p_Var16 = (root_holder->nested_children_ptr).
                super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
                ._M_impl._M_node.super__List_node_base._M_prev;
      local_118._M_dataplus._M_p =
           (pointer)vector<ArrowSchema,_true>::operator[]
                              ((vector<ArrowSchema,_true> *)
                               ((root_holder->nested_children).
                                super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                                ._M_impl._M_node.super__List_node_base._M_prev + 1),0);
      iVar6._M_current = (ArrowSchema **)p_Var16[1]._M_prev;
      if ((_List_node_base *)iVar6._M_current == p_Var16[2]._M_next) {
        ::std::vector<ArrowSchema*,std::allocator<ArrowSchema*>>::_M_realloc_insert<ArrowSchema*>
                  ((vector<ArrowSchema*,std::allocator<ArrowSchema*>> *)(p_Var16 + 1),iVar6,
                   (ArrowSchema **)&local_118);
      }
      else {
        *iVar6._M_current = (ArrowSchema *)local_118._M_dataplus._M_p;
        p_Var16[1]._M_prev = (_List_node_base *)&(p_Var16[1]._M_prev)->_M_prev;
      }
      pvVar17 = vector<ArrowSchema,_true>::operator[]
                          ((vector<ArrowSchema,_true> *)
                           ((root_holder->nested_children).
                            super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                            ._M_impl._M_node.super__List_node_base._M_prev + 1),0);
      local_118._M_dataplus._M_p = (pointer)paVar2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,anon_var_dwarf_63b5960 + 9);
      InitializeChild(pvVar17,root_holder,&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      ppAVar18 = vector<ArrowSchema_*,_true>::operator[]
                           ((vector<ArrowSchema_*,_true> *)
                            ((root_holder->nested_children_ptr).
                             super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
                             ._M_impl._M_node.super__List_node_base._M_prev + 1),0);
      child->children = ppAVar18;
      SetArrowFormat(root_holder,*ppAVar18,(LogicalType *)local_d8,options,local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p == &local_f8.field_2) {
        return;
      }
      goto LAB_0159ba77;
    }
LAB_0159b85c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p == &local_f8.field_2) {
      return;
    }
LAB_0159ba77:
    operator_delete(local_f8._M_dataplus._M_p);
    return;
  }
LAB_0159b457:
  child->format = pcVar11;
  return;
switchD_0159ab03_caseD_10:
  pcVar11 = "ttu";
  goto LAB_0159b457;
}

Assistant:

void SetArrowFormat(DuckDBArrowSchemaHolder &root_holder, ArrowSchema &child, const LogicalType &type,
                    ClientProperties &options, ClientContext &context) {
	if (type.HasAlias()) {
		// If it is a json type, we only export it as json if arrow_lossless_conversion = True
		if (!(type.IsJSONType() && !options.arrow_lossless_conversion)) {
			// If the type has an alias, we check if it is an Arrow-Type extension
			if (SetArrowExtension(root_holder, child, type, context)) {
				return;
			}
		}
	}
	switch (type.id()) {
	case LogicalTypeId::BOOLEAN:
		if (options.arrow_lossless_conversion) {
			SetArrowExtension(root_holder, child, type, context);
		} else {
			child.format = "b";
		}
		break;
	case LogicalTypeId::TINYINT:
		child.format = "c";
		break;
	case LogicalTypeId::SMALLINT:
		child.format = "s";
		break;
	case LogicalTypeId::INTEGER:
		child.format = "i";
		break;
	case LogicalTypeId::BIGINT:
		child.format = "l";
		break;
	case LogicalTypeId::UTINYINT:
		child.format = "C";
		break;
	case LogicalTypeId::USMALLINT:
		child.format = "S";
		break;
	case LogicalTypeId::UINTEGER:
		child.format = "I";
		break;
	case LogicalTypeId::UBIGINT:
		child.format = "L";
		break;
	case LogicalTypeId::FLOAT:
		child.format = "f";
		break;
	case LogicalTypeId::HUGEINT: {
		if (options.arrow_lossless_conversion) {
			SetArrowExtension(root_holder, child, type, context);
		} else {
			child.format = "d:38,0";
		}
		break;
	}
	case LogicalTypeId::DOUBLE:
		child.format = "g";
		break;
	case LogicalTypeId::UUID: {
		if (options.arrow_lossless_conversion) {
			SetArrowExtension(root_holder, child, type, context);
		} else {
			if (options.produce_arrow_string_view) {
				child.format = "vu";
			} else {
				if (options.arrow_offset_size == ArrowOffsetSize::LARGE) {
					child.format = "U";
				} else {
					child.format = "u";
				}
			}
		}
		break;
	}
	case LogicalTypeId::VARCHAR:
		if (options.produce_arrow_string_view) {
			child.format = "vu";
		} else {
			if (options.arrow_offset_size == ArrowOffsetSize::LARGE) {
				child.format = "U";
			} else {
				child.format = "u";
			}
		}
		break;
	case LogicalTypeId::DATE:
		child.format = "tdD";
		break;
	case LogicalTypeId::TIME_TZ: {
		if (options.arrow_lossless_conversion) {
			SetArrowExtension(root_holder, child, type, context);
		} else {
			child.format = "ttu";
		}
		break;
	}
	case LogicalTypeId::TIME:
		child.format = "ttu";
		break;
	case LogicalTypeId::TIMESTAMP:
		child.format = "tsu:";
		break;
	case LogicalTypeId::TIMESTAMP_TZ: {
		string format = "tsu:" + options.time_zone;
		root_holder.owned_type_names.push_back(AddName(format));
		child.format = root_holder.owned_type_names.back().get();
		break;
	}
	case LogicalTypeId::TIMESTAMP_SEC:
		child.format = "tss:";
		break;
	case LogicalTypeId::TIMESTAMP_NS:
		child.format = "tsn:";
		break;
	case LogicalTypeId::TIMESTAMP_MS:
		child.format = "tsm:";
		break;
	case LogicalTypeId::INTERVAL:
		child.format = "tin";
		break;
	case LogicalTypeId::DECIMAL: {
		uint8_t width, scale;
		type.GetDecimalProperties(width, scale);
		string format = "d:" + to_string(width) + "," + to_string(scale);
		root_holder.owned_type_names.push_back(AddName(format));
		child.format = root_holder.owned_type_names.back().get();
		break;
	}
	case LogicalTypeId::SQLNULL: {
		child.format = "n";
		break;
	}
	case LogicalTypeId::BLOB:
		if (options.arrow_offset_size == ArrowOffsetSize::LARGE) {
			child.format = "Z";
		} else {
			child.format = "z";
		}
		break;
	case LogicalTypeId::BIT: {
		if (options.arrow_lossless_conversion) {
			SetArrowExtension(root_holder, child, type, context);
		} else {
			if (options.arrow_offset_size == ArrowOffsetSize::LARGE) {
				child.format = "Z";
			} else {
				child.format = "z";
			}
		}

		break;
	}
	case LogicalTypeId::LIST: {
		if (options.arrow_use_list_view) {
			if (options.arrow_offset_size == ArrowOffsetSize::LARGE) {
				child.format = "+vL";
			} else {
				child.format = "+vl";
			}
		} else {
			if (options.arrow_offset_size == ArrowOffsetSize::LARGE) {
				child.format = "+L";
			} else {
				child.format = "+l";
			}
		}
		child.n_children = 1;
		root_holder.nested_children.emplace_back();
		root_holder.nested_children.back().resize(1);
		root_holder.nested_children_ptr.emplace_back();
		root_holder.nested_children_ptr.back().push_back(&root_holder.nested_children.back()[0]);
		InitializeChild(root_holder.nested_children.back()[0], root_holder);
		child.children = &root_holder.nested_children_ptr.back()[0];
		child.children[0]->name = "l";
		SetArrowFormat(root_holder, **child.children, ListType::GetChildType(type), options, context);
		break;
	}
	case LogicalTypeId::STRUCT: {
		SetArrowStructFormat(root_holder, child, type, options, context);
		break;
	}
	case LogicalTypeId::ARRAY: {
		auto array_size = ArrayType::GetSize(type);
		auto &child_type = ArrayType::GetChildType(type);
		auto format = "+w:" + to_string(array_size);
		root_holder.owned_type_names.push_back(AddName(format));
		child.format = root_holder.owned_type_names.back().get();

		child.n_children = 1;
		root_holder.nested_children.emplace_back();
		root_holder.nested_children.back().resize(1);
		root_holder.nested_children_ptr.emplace_back();
		root_holder.nested_children_ptr.back().push_back(&root_holder.nested_children.back()[0]);
		InitializeChild(root_holder.nested_children.back()[0], root_holder);
		child.children = &root_holder.nested_children_ptr.back()[0];
		SetArrowFormat(root_holder, **child.children, child_type, options, context);
		break;
	}
	case LogicalTypeId::MAP: {
		SetArrowMapFormat(root_holder, child, type, options, context);
		break;
	}
	case LogicalTypeId::UNION: {
		std::string format = "+us:";

		auto &child_types = UnionType::CopyMemberTypes(type);
		child.n_children = NumericCast<int64_t>(child_types.size());
		root_holder.nested_children.emplace_back();
		root_holder.nested_children.back().resize(child_types.size());
		root_holder.nested_children_ptr.emplace_back();
		root_holder.nested_children_ptr.back().resize(child_types.size());
		for (idx_t type_idx = 0; type_idx < child_types.size(); type_idx++) {
			root_holder.nested_children_ptr.back()[type_idx] = &root_holder.nested_children.back()[type_idx];
		}
		child.children = &root_holder.nested_children_ptr.back()[0];
		for (size_t type_idx = 0; type_idx < child_types.size(); type_idx++) {

			InitializeChild(*child.children[type_idx], root_holder);

			root_holder.owned_type_names.push_back(AddName(child_types[type_idx].first));

			child.children[type_idx]->name = root_holder.owned_type_names.back().get();
			SetArrowFormat(root_holder, *child.children[type_idx], child_types[type_idx].second, options, context);

			format += to_string(type_idx) + ",";
		}

		format.pop_back();

		root_holder.owned_type_names.push_back(AddName(format));
		child.format = root_holder.owned_type_names.back().get();

		break;
	}
	case LogicalTypeId::ENUM: {
		// TODO what do we do with pointer enums here?
		switch (EnumType::GetPhysicalType(type)) {
		case PhysicalType::UINT8:
			child.format = "C";
			break;
		case PhysicalType::UINT16:
			child.format = "S";
			break;
		case PhysicalType::UINT32:
			child.format = "I";
			break;
		default:
			throw InternalException("Unsupported Enum Internal Type");
		}
		root_holder.nested_children.emplace_back();
		root_holder.nested_children.back().resize(1);
		root_holder.nested_children_ptr.emplace_back();
		root_holder.nested_children_ptr.back().push_back(&root_holder.nested_children.back()[0]);
		InitializeChild(root_holder.nested_children.back()[0], root_holder);
		child.dictionary = root_holder.nested_children_ptr.back()[0];
		child.dictionary->format = "u";
		break;
	}
	default: {
		// It is possible we can export this type as a registered extension
		auto success = SetArrowExtension(root_holder, child, type, context);
		if (!success) {
			throw NotImplementedException("Unsupported Arrow type %s", type.ToString());
		}
	}
	}
}